

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QSocks5RevivedDatagram>::moveAppend
          (QGenericArrayOps<QSocks5RevivedDatagram> *this,QSocks5RevivedDatagram *b,
          QSocks5RevivedDatagram *e)

{
  qsizetype *pqVar1;
  QSocks5RevivedDatagram *pQVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  QHostAddressPrivate *pQVar7;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
      pDVar4 = (b->data).d.d;
      (b->data).d.d = (Data *)0x0;
      pQVar2[lVar3].data.d.d = pDVar4;
      pcVar5 = (b->data).d.ptr;
      (b->data).d.ptr = (char *)0x0;
      pQVar2[lVar3].data.d.ptr = pcVar5;
      qVar6 = (b->data).d.size;
      (b->data).d.size = 0;
      pQVar2[lVar3].data.d.size = qVar6;
      pQVar7 = (b->address).d.d.ptr;
      (b->address).d.d.ptr = (QHostAddressPrivate *)0x0;
      pQVar2[lVar3].address.d.d.ptr = pQVar7;
      pQVar2[lVar3].port = b->port;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }